

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_type.cc
# Opt level: O0

void __thiscall iqxmlrpc::Struct::Struct(Struct *this,Struct *other)

{
  Struct_inserter local_40;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
  local_38;
  _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>
  local_20;
  Struct *local_18;
  Struct *other_local;
  Struct *this_local;
  
  local_18 = other;
  other_local = this;
  Value_type::Value_type(&this->super_Value_type);
  (this->super_Value_type)._vptr_Value_type = (_func_int **)&PTR__Struct_00254dc0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_iqxmlrpc::Value_*>_>_>
  ::map(&this->values);
  local_20._M_node = (_Base_ptr)begin_abi_cxx11_(local_18);
  local_38._M_node = (_Base_ptr)end_abi_cxx11_(local_18);
  Struct_inserter::Struct_inserter(&local_40,&this->values);
  std::
  for_each<std::_Rb_tree_const_iterator<std::pair<std::__cxx11::string_const,iqxmlrpc::Value*>>,iqxmlrpc::Struct::Struct_inserter>
            (local_20,local_38,local_40);
  return;
}

Assistant:

Struct::Struct( const Struct& other )
{
  std::for_each( other.begin(), other.end(), Struct_inserter(&values) );
}